

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

int Am_Connection::Merge_Mask(fd_set *fds)

{
  int iVar1;
  Connection_List_Ptr pcVar2;
  Am_Connection_Data *pAVar3;
  Connection_List_Ptr *ppcVar4;
  int iVar5;
  
  fds->fds_bits[m_parent_socket / 0x40] =
       fds->fds_bits[m_parent_socket / 0x40] | 1L << ((byte)m_parent_socket & 0x3f);
  iVar5 = max_socket;
  if (num_sockets != 0) {
    ppcVar4 = &connection_list;
    while (pcVar2 = *ppcVar4, pcVar2 != (Connection_List_Ptr)0x0) {
      pAVar3 = pcVar2->connection_ptr->data;
      if (pAVar3->connected == true) {
        iVar1 = *(int *)&(pAVar3->super_Am_Wrapper).field_0xc;
        fds->fds_bits[iVar1 / 0x40] = fds->fds_bits[iVar1 / 0x40] | 1L << ((byte)iVar1 & 0x3f);
        if (iVar5 < iVar1) {
          iVar5 = iVar1;
          max_socket = iVar1;
        }
      }
      ppcVar4 = &pcVar2->next;
    }
  }
  return iVar5 + 1;
}

Assistant:

int
Am_Connection::Merge_Mask(fd_set *fds)
{
  Connection_List_Ptr place_holder;
  FD_SET(m_parent_socket, fds);
  if (num_sockets != 0) {
    place_holder = connection_list;
    while (place_holder != nullptr) {
      ;
      //                     fds) <<std::flush;
      if (place_holder->connection_ptr->Connected()) {
        FD_SET(place_holder->connection_ptr->Get_Socket(), fds);
        if (place_holder->connection_ptr->Get_Socket() > max_socket)
          max_socket = place_holder->connection_ptr->Get_Socket();
      }
      //else
      place_holder = place_holder->next;
    }
  }
  return max_socket + 1;
}